

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::allow_move(xml_node parent,xml_node child)

{
  bool bVar1;
  xml_node_type parent_00;
  xml_node_type child_00;
  unspecified_bool_type p_Var2;
  xml_node_struct *in_RDI;
  xml_node cur;
  xml_node *in_stack_ffffffffffffffb8;
  xml_node local_30;
  xml_node local_28;
  xml_node local_20;
  xml_node local_18;
  xml_node local_10;
  bool local_1;
  
  local_10._root = in_RDI;
  parent_00 = xml_node::type(&local_10);
  child_00 = xml_node::type(&local_18);
  bVar1 = allow_insert_child(parent_00,child_00);
  if (bVar1) {
    local_20 = xml_node::root(in_stack_ffffffffffffffb8);
    local_28 = xml_node::root(in_stack_ffffffffffffffb8);
    bVar1 = xml_node::operator!=(&local_20,&local_28);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_30._root = local_10._root;
      while (p_Var2 = xml_node::operator_cast_to_function_pointer(&local_30),
            p_Var2 != (unspecified_bool_type)0x0) {
        bVar1 = xml_node::operator==(&local_30,&local_18);
        if (bVar1) {
          return false;
        }
        local_30 = xml_node::parent(in_stack_ffffffffffffffb8);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

PUGI__FN bool allow_move(xml_node parent, xml_node child)
	{
		// check that child can be a child of parent
		if (!allow_insert_child(parent.type(), child.type()))
			return false;

		// check that node is not moved between documents
		if (parent.root() != child.root())
			return false;

		// check that new parent is not in the child subtree
		xml_node cur = parent;

		while (cur)
		{
			if (cur == child)
				return false;

			cur = cur.parent();
		}

		return true;
	}